

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,char *protopath)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen(protopath,"rb");
  if (__stream == (FILE *)0x0) {
    load_param((Net *)protopath);
    iVar1 = -1;
  }
  else {
    iVar1 = load_param(this,(FILE *)__stream);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Net::load_param(const char* protopath)
{
    FILE* fp = fopen(protopath, "rb");
    if (!fp)
    {
        NCNN_LOGE("fopen %s failed", protopath);
        return -1;
    }

    int ret = load_param(fp);
    fclose(fp);
    return ret;
}